

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O0

void __thiscall xe::ri::ImageSet::~ImageSet(ImageSet *this)

{
  ImageSet *this_local;
  
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__ImageSet_001b32c8;
  List::~List(&this->images);
  std::__cxx11::string::~string((string *)&this->description);
  std::__cxx11::string::~string((string *)&this->name);
  Item::~Item(&this->super_Item);
  return;
}

Assistant:

~ImageSet		(void) {}